

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::MeshLoader::initializeBinormalsOffset(MeshLoader *this)

{
  InputShared *this_00;
  unsigned_long_long uVar1;
  URI *this_01;
  SourceBase *this_02;
  size_t sVar2;
  SourceArrayLoader *in_RDI;
  unsigned_long_long stride;
  SourceBase *sourceBase;
  InputShared *binormalInput;
  MeshPrimitiveInputList *in_stack_ffffffffffffffe0;
  SourceArrayLoader *this_03;
  
  this_03 = in_RDI;
  this_00 = MeshPrimitiveInputList::getBinormalInput(in_stack_ffffffffffffffe0);
  if (this_00 == (InputShared *)0x0) {
    *(undefined4 *)&in_RDI[3].mCurrentArrayId._M_string_length = 0;
    *(undefined1 *)((long)&in_RDI[3].mCurrentArrayId._M_string_length + 4) = 0;
  }
  else {
    uVar1 = InputShared::getOffset(this_00);
    *(unsigned_long_long *)&in_RDI[3].mCurrentArrayId = uVar1;
    this_01 = InputUnshared::getSource(&this_00->super_InputUnshared);
    COLLADABU::URI::getFragment_abi_cxx11_(this_01);
    this_02 = SourceArrayLoader::getSourceById(this_03,(String *)this_00);
    if (this_02 == (SourceBase *)0x0) {
      *(undefined4 *)&in_RDI[3].mCurrentArrayId._M_string_length = 0;
      *(undefined1 *)((long)&in_RDI[3].mCurrentArrayId._M_string_length + 4) = 0;
    }
    else {
      uVar1 = SourceBase::getStride(this_02);
      if (uVar1 == 3) {
        sVar2 = SourceBase::getInitialIndex(this_02);
        *(int *)&in_RDI[3].mCurrentArrayId._M_string_length = (int)(sVar2 / uVar1);
        *(undefined1 *)((long)&in_RDI[3].mCurrentArrayId._M_string_length + 4) = 1;
      }
      else {
        *(undefined4 *)&in_RDI[3].mCurrentArrayId._M_string_length = 0;
        *(undefined1 *)((long)&in_RDI[3].mCurrentArrayId._M_string_length + 4) = 0;
      }
    }
  }
  return;
}

Assistant:

void MeshLoader::initializeBinormalsOffset ()
    {
        // Check for using normals
        const InputShared* binormalInput = mMeshPrimitiveInputs.getBinormalInput ();
        if ( binormalInput != 0 ) 
        {
            // Get the offset value, the initial index values and alloc the memory.
            mBinormalsOffset = binormalInput->getOffset ();
            const SourceBase* sourceBase = getSourceById ( binormalInput->getSource ().getFragment () );
            if ( !sourceBase )
            {
                mBinormalsIndexOffset = 0;
                mUseBinormals = false;
            }
            else 
            {
                // only stride 3 makes sense for normals
                unsigned long long stride = sourceBase->getStride();
                if ( stride == 3 )
                {
                    mBinormalsIndexOffset = (unsigned int)(sourceBase->getInitialIndex() / stride);
                    mUseBinormals = true;
                }
                else
                {
                    mBinormalsIndexOffset = 0;
                    mUseBinormals = false;
                }
            }
        }
        else
        {
            mBinormalsIndexOffset = 0;
            mUseBinormals = false;
        }
    }